

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult
testing::internal::CmpHelperEQFailure<std::__cxx11::string,char[6]>
          (char *lhs_expression,char *rhs_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [6])

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  char *in_stack_ffffffffffffff98;
  string local_60;
  string local_40;
  
  PrintToString<std::__cxx11::string>(&local_40,(testing *)rhs,lhs);
  FormatForComparison<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Format(in_stack_ffffffffffffff98);
  EqFailure((internal *)lhs_expression,rhs_expression,(char *)lhs,(string *)&local_40,&local_60,
            false);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = lhs_expression;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}